

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

bool __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
DomainIteratorCore::hasNext(DomainIteratorCore *this)

{
  bool bVar1;
  
  bVar1 = DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
          IteratorBase::hasNext(&this->_base);
  return bVar1;
}

Assistant:

inline bool hasNext() { return _base.hasNext(); }